

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

void Utils::print_vec_from_to
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,int from,int to)

{
  ostream *poVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = 0;
  for (lVar2 = (long)from; lVar2 < to; lVar2 = lVar2 + 1) {
    if (0x18 < iVar3) {
      poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::operator<<(poVar1,"                                    ");
      iVar3 = 0;
    }
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar1,' ');
    iVar3 = iVar3 + 1;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void Utils::print_vec_from_to(std::vector<unsigned int> vec, int from, int to) {
    int count = 0;
    for (int i = from; i < to; ++i) {
        if(count >= 25) {
            std::cout << endl << "                                    ";
            count = 0;
        }
        std::cout << hex << vec[i] << ' ';
        ++count;
    }
    std::cout << endl;
}